

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void verb_prog_twist_two_faced(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  char *txt;
  char *format;
  
  if (*argument != '\0') {
    iVar2 = strcmp(argument,"clockwise");
    if (iVar2 == 0) {
      iVar2 = 0x23;
      format = "$n twists the sundial clockwise.";
      txt = "You twist the sundial clockwise.\n\r";
    }
    else {
      iVar2 = strcmp(argument,"counterclockwise");
      if (iVar2 != 0) goto LAB_0032f2b0;
      iVar2 = 0x41;
      format = "$n twists the sundial counterclockwise.";
      txt = "You twist the sundial counterclockwise.\n\r";
    }
    send_to_char(txt,ch);
    act(format,ch,(void *)0x0,(void *)0x0,0);
    iVar3 = number_percent();
    if (iVar2 < iVar3) {
      act("The faces of the statue seem to grin maniacally.",ch,(void *)0x0,(void *)0x0,4);
      send_to_char("A stream of acid shoots out of the mouth of the statue at you!\n\r",ch);
      act("A stream of acid shoots out of the mouth of the statue at $n!",ch,(void *)0x0,(void *)0x0
          ,0);
      spell_acid_stream((int)gsn_acid_stream,ch->level + 1,ch,ch,0);
      if (ch->ghost == 0) {
        send_to_char("A small dart flies out of the eye of the statue, barely piercing your skin.\n\r"
                     ,ch);
        act("A small dart flies out of the eye of the statue, barely piercing $n\'s skin.",ch,
            (void *)0x0,(void *)0x0,0);
        spell_plague((int)gsn_plague,ch->level + 5,ch,ch,0);
        return;
      }
    }
    else {
      send_to_char("As you rotate the sundial, a trap door beneath the table slowly swings open!\n\r"
                   ,ch);
      plVar1 = ch->in_room->exit[5]->exit_info;
      *plVar1 = *plVar1 & 0xfffffffffffffff9;
    }
    return;
  }
LAB_0032f2b0:
  send_to_char("Which way do you want to turn it?  You could twist it clockwise or counterclockwise.\n\r"
               ,ch);
  return;
}

Assistant:

void verb_prog_twist_two_faced(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	int nChance = 0;
	EXIT_DATA *pexit;
	if (!argument[0] || (strcmp(argument, "clockwise") && strcmp(argument, "counterclockwise")))
	{
		send_to_char("Which way do you want to turn it?  You could twist it clockwise or counterclockwise.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "clockwise"))
	{
		send_to_char("You twist the sundial clockwise.\n\r", ch);
		act("$n twists the sundial clockwise.", ch, 0, 0, TO_ROOM);
		nChance = 35;
	}
	else
	{
		send_to_char("You twist the sundial counterclockwise.\n\r", ch);
		act("$n twists the sundial counterclockwise.", ch, 0, 0, TO_ROOM);
		nChance = 65;
	}

	if (number_percent() > nChance)
	{
		act("The faces of the statue seem to grin maniacally.", ch, 0, 0, TO_ALL);
		send_to_char("A stream of acid shoots out of the mouth of the statue at you!\n\r", ch);
		act("A stream of acid shoots out of the mouth of the statue at $n!", ch, 0, 0, TO_ROOM);
		spell_acid_stream(gsn_acid_stream, ch->level + 1, ch, ch, TARGET_CHAR);

		if (ch->ghost)
			return;

		send_to_char("A small dart flies out of the eye of the statue, barely piercing your skin.\n\r", ch);
		act("A small dart flies out of the eye of the statue, barely piercing $n's skin.", ch, 0, 0, TO_ROOM);
		spell_plague(gsn_plague, ch->level + 5, ch, ch, TARGET_CHAR);
	}
	else
	{
		send_to_char("As you rotate the sundial, a trap door beneath the table slowly swings open!\n\r", ch);

		pexit = ch->in_room->exit[Directions::Down];

		REMOVE_BIT(pexit->exit_info, EX_LOCKED);
		REMOVE_BIT(pexit->exit_info, EX_CLOSED);
	}
}